

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

void leb_ComputeSumReduction(leb_Heap *leb)

{
  uint uVar1;
  leb_Heap *leb_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t tmp1;
  uint uVar6;
  leb_Node node;
  leb_Node node_00;
  leb_Node node_01;
  leb_Node node_02;
  leb_Node node_03;
  leb_Node node_04;
  leb_Node node_05;
  int iVar7;
  uint uVar8;
  int local_60;
  
  iVar7 = leb->maxDepth;
  uVar6 = 2 << ((byte)iVar7 & 0x1f);
  uVar3 = 1 << ((byte)iVar7 & 0x1f);
  for (uVar8 = uVar3; uVar8 < uVar6; uVar8 = uVar8 + 0x20) {
    uVar4 = ((leb->maxDepth - iVar7) + 1) * uVar8 + uVar6;
    leb_00 = (leb_Heap *)leb->buffer;
    uVar1 = *(uint *)((long)&leb_00->buffer + (ulong)(uVar4 >> 5) * 4);
    *(uint *)((long)&leb_00->buffer + (ulong)(uVar4 - uVar3 >> 5) * 4) =
         (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555);
    node.depth = 0;
    node.id = leb->maxDepth;
    leb__HeapWriteExplicit(leb_00,node,uVar8 >> 2,0x18);
    node_00.depth = 0;
    node_00.id = leb->maxDepth;
    leb__HeapWriteExplicit((leb_Heap *)leb->buffer,node_00,uVar8 >> 3,0x10);
    node_01.depth = 0;
    node_01.id = leb->maxDepth;
    leb__HeapWriteExplicit((leb_Heap *)leb->buffer,node_01,uVar8 >> 4,10);
    node_02.depth = 0;
    node_02.id = leb->maxDepth;
    leb__HeapWriteExplicit((leb_Heap *)leb->buffer,node_02,uVar8 >> 5,6);
  }
  if (5 < iVar7) {
    uVar5 = (ulong)(iVar7 - 6);
    do {
      uVar8 = 1 << ((byte)uVar5 & 0x1f);
      uVar3 = 2 << ((byte)uVar5 & 0x1f);
      iVar7 = uVar3 - uVar8;
      if (uVar8 <= uVar3 && iVar7 != 0) {
        do {
          node_03.depth = 0;
          node_03.id = leb->maxDepth;
          leb__HeapRead((leb_Heap *)leb->buffer,node_03);
          node_04.depth = 0;
          node_04.id = leb->maxDepth;
          leb__HeapRead((leb_Heap *)leb->buffer,node_04);
          node_05.depth = 0;
          node_05.id = leb->maxDepth;
          local_60 = (int)uVar5;
          leb__HeapWriteExplicit
                    ((leb_Heap *)leb->buffer,node_05,uVar8,(leb->maxDepth - local_60) + 1);
          uVar8 = uVar8 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      bVar2 = 0 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

LEBDEF void leb_ComputeSumReduction(leb_Heap *leb)
{
    int depth = leb->maxDepth;
    uint32_t minNodeID = (1u << depth);
    uint32_t maxNodeID = (2u << depth);

    // prepass: processes deepest levels in parallel
    for (uint32_t nodeID = minNodeID; nodeID < maxNodeID; nodeID+= 32u) {
        uint32_t alignedBitOffset = leb__NodeBitID(leb, {nodeID, depth});
        uint32_t bitField = leb->buffer[alignedBitOffset >> 5u];
        uint32_t bitData = 0u;

        // 2-bits
        bitField = (bitField & 0x55555555u) + ((bitField >> 1u) & 0x55555555u);
        bitData = bitField;
        leb->buffer[(alignedBitOffset - minNodeID) >> 5u] = bitData;

        // 3-bits
        bitField = (bitField & 0x33333333u) + ((bitField >>  2u) & 0x33333333u);
        bitData = ((bitField >> 0u) & (7u <<  0u))
                | ((bitField >> 1u) & (7u <<  3u))
                | ((bitField >> 2u) & (7u <<  6u))
                | ((bitField >> 3u) & (7u <<  9u))
                | ((bitField >> 4u) & (7u << 12u))
                | ((bitField >> 5u) & (7u << 15u))
                | ((bitField >> 6u) & (7u << 18u))
                | ((bitField >> 7u) & (7u << 21u));
        leb__HeapWriteExplicit(leb, {nodeID >> 2u, depth - 2}, 24u, bitData);

        // 4-bits
        bitField = (bitField & 0x0F0F0F0Fu) + ((bitField >>  4u) & 0x0F0F0F0Fu);
        bitData = ((bitField >>  0u) & (15u <<  0u))
                | ((bitField >>  4u) & (15u <<  4u))
                | ((bitField >>  8u) & (15u <<  8u))
                | ((bitField >> 12u) & (15u << 12u));
        leb__HeapWriteExplicit(leb, {nodeID >> 3u, depth - 3}, 16u, bitData);

        // 5-bits
        bitField = (bitField & 0x00FF00FFu) + ((bitField >>  8u) & 0x00FF00FFu);
        bitData = ((bitField >>  0u) & (31u << 0u))
                | ((bitField >> 11u) & (31u << 5u));
        leb__HeapWriteExplicit(leb, {nodeID >> 4u, depth - 4}, 10u, bitData);

        // 6-bits
        bitField = (bitField & 0x0000FFFFu) + ((bitField >> 16u) & 0x0000FFFFu);
        bitData = bitField;
        leb__HeapWriteExplicit(leb, {nodeID >> 5u, depth - 5},  6u, bitData);
    }
    depth-= 5;

    // iterate over elements atomically
    while (--depth >= 0) {
        uint32_t minNodeID = 1u << depth;
        uint32_t maxNodeID = 2u << depth;

        for (uint32_t j = minNodeID; j < maxNodeID; ++j) {
            uint32_t x0 = leb__HeapRead(leb, {j << 1u     , depth + 1});
            uint32_t x1 = leb__HeapRead(leb, {j << 1u | 1u, depth + 1});

            leb__HeapWrite(leb, {j, depth}, x0 + x1);
        }
    }
}